

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_SetBlendMode(GPU_Image *image,GPU_BlendPresetEnum preset)

{
  undefined4 source_color;
  undefined1 auVar1 [8];
  undefined4 dest_color;
  GPU_BlendFuncEnum source_alpha;
  undefined8 uVar2;
  GPU_BlendFuncEnum dest_alpha;
  undefined1 local_44 [24];
  undefined1 local_2c [8];
  GPU_BlendMode b;
  GPU_BlendPresetEnum preset_local;
  GPU_Image *image_local;
  
  if (image != (GPU_Image *)0x0) {
    b.color_equation = preset;
    unique0x10000087 = image;
    GPU_GetBlendModeFromPreset((GPU_BlendMode *)local_44,preset);
    local_2c = (undefined1  [8])local_44._0_8_;
    auVar1 = local_2c;
    b.source_color = local_44._8_4_;
    b.dest_color = local_44._12_4_;
    uVar2 = b._0_8_;
    b.source_alpha = local_44._16_4_;
    b.dest_alpha = local_44._20_4_;
    local_2c._0_4_ = (undefined4)local_44._0_8_;
    source_color = local_2c._0_4_;
    local_2c._4_4_ = SUB84(local_44._0_8_,4);
    dest_color = local_2c._4_4_;
    b.source_color = (GPU_BlendFuncEnum)local_44._8_8_;
    source_alpha = b.source_color;
    b.dest_color = SUB84(local_44._8_8_,4);
    dest_alpha = b.dest_color;
    local_2c = auVar1;
    b._0_8_ = uVar2;
    GPU_SetBlendFunction(stack0xfffffffffffffff0,source_color,dest_color,source_alpha,dest_alpha);
    GPU_SetBlendEquation(stack0xfffffffffffffff0,b.source_alpha,b.dest_alpha);
  }
  return;
}

Assistant:

void GPU_SetBlendMode(GPU_Image* image, GPU_BlendPresetEnum preset)
{
    GPU_BlendMode b;
    if(image == NULL)
        return;

    b = GPU_GetBlendModeFromPreset(preset);
    GPU_SetBlendFunction(image, b.source_color, b.dest_color, b.source_alpha, b.dest_alpha);
    GPU_SetBlendEquation(image, b.color_equation, b.alpha_equation);
}